

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

int zt_opt_bool_int(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  uint uVar1;
  int iVar2;
  byte *__s;
  size_t sVar3;
  undefined4 uVar4;
  int args_consumed;
  int local_3c;
  zt_opt_error local_38;
  
  local_3c = 0;
  local_38 = error;
  __s = (byte *)zt_opt_get_value(argn,defn,argv,def,&local_3c,error);
  sVar3 = strlen((char *)__s);
  if (sVar3 == 1) {
    uVar1 = *__s - 0x46;
    if (0x33 < uVar1) {
LAB_00104312:
      (*local_38)(0x16,"\'%s\' is not a boolean expression",argv[argn]);
      return 0;
    }
    if ((0x10100000101U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      uVar4 = 1;
      if ((0x8400000084000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_00104312;
    }
    else {
      uVar4 = 0;
    }
  }
  else {
    iVar2 = strcasecmp((char *)__s,"true");
    uVar4 = 1;
    if ((iVar2 != 0) && (iVar2 = strcasecmp((char *)__s,"yes"), iVar2 != 0)) {
      iVar2 = strcasecmp((char *)__s,"false");
      uVar4 = 0;
      if ((iVar2 != 0) && (iVar2 = strcasecmp((char *)__s,"no"), iVar2 != 0)) goto LAB_00104312;
    }
  }
  if ((undefined4 *)def[defn].cb_data != (undefined4 *)0x0) {
    *(undefined4 *)def[defn].cb_data = uVar4;
  }
  return local_3c;
}

Assistant:

int
zt_opt_bool_int(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    int    result;
    size_t len;
    int    args_consumed = 0;
    char * arg = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    len = strlen(arg);

    if (len == 1) {
        switch (*arg) {
            case 't':
            case 'T':
            case 'y':
            case 'Y':
                result = 1;
                break;
            case 'f':
            case 'F':
            case 'n':
            case 'N':
                result = 0;
                break;
            default:
                error(EINVAL, "'%s' is not a boolean expression", argv[argn]);
                return 0;
        }
    } else {
        if (strcasecmp(arg, "true") == 0 ||
            strcasecmp(arg, "yes") == 0) {
            result = 1;
        } else if (strcasecmp(arg, "false") == 0 ||
                   strcasecmp(arg, "no") == 0) {
            result = 0;
        } else {
            error(EINVAL, "'%s' is not a boolean expression", argv[argn]);
            return 0;
        }
    }

    if (def[defn].cb_data) {
        *(int *)def[defn].cb_data = result;
    }

    return args_consumed;
}